

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Status google::protobuf::json_internal::anon_unknown_5::
       ParseMap<google::protobuf::json_internal::ParseProto3Type>
                 (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto3Type> field,
                 Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  int *piVar1;
  StringOutputStream *this;
  int iVar2;
  ulong uVar3;
  uint8_t *puVar4;
  _Alloc_hider _Var5;
  undefined4 uVar6;
  bool bVar7;
  char cVar8;
  int64_t iVar9;
  byte *pbVar10;
  undefined8 uVar11;
  Msg *in_RCX;
  uint uVar12;
  uint uVar13;
  Status *_status;
  char *in_R8;
  string_view literal;
  string_view url;
  string_view literal_00;
  string_view literal_01;
  string_view x;
  string out;
  StringOutputStream stream;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_seen;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  insert_result;
  bool local_1c9;
  string local_1c0;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
  local_1a0;
  Msg<google::protobuf::json_internal::ParseProto3Type> *local_198;
  Msg<google::protobuf::json_internal::ParseProto3Type> *local_190;
  char *local_188;
  Field<google::protobuf::json_internal::ParseProto3Type> local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [40];
  undefined1 local_130 [64];
  _Head_base<0UL,_google::protobuf::json_internal::ResolverPool::Field_*,_false> local_f0;
  int local_e8;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_e0;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_c0;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_a0;
  ResolverPool local_98;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_48;
  
  JsonLexer::PeekKind((JsonLexer *)local_130);
  uVar11 = local_130._0_8_;
  uVar6 = local_130._8_4_;
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)local_130);
  if (((Arena *)uVar11 == (Arena *)0x1) && (uVar6 == 6)) {
    JsonLexer::Expect(lex,field,4,"null");
    return (Status)lex;
  }
  local_158._0_8_ = (_func_int **)0x0;
  local_158._8_8_ = (string *)0x0;
  local_158._16_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  JsonLexer::Expect(lex,field,1,"{");
  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
    iVar2 = *(int *)((long)&field[2].parent_ + 4);
    if (iVar2 == 0) {
      JsonLocation::Invalid((JsonLocation *)lex,field + 3,0x22,"JSON content was too deeply nested")
      ;
    }
    else {
      *(int *)((long)&field[2].parent_ + 4) = iVar2 + -1;
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
      literal._M_str = "}";
      literal._M_len = 1;
      bVar7 = JsonLexer::Peek((JsonLexer *)field,literal);
      if (bVar7) {
        piVar1 = (int *)((long)&field[2].parent_ + 4);
        *piVar1 = *piVar1 + 1;
      }
      else {
        local_180 = field + 3;
        local_1c9 = true;
        local_188 = "expected \',\'";
        this = (StringOutputStream *)(local_178 + 0x10);
        do {
          if (local_1c9 == false) goto LAB_002cdc2c;
          JsonLexer::SkipToToken(lex);
          if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002cdc43;
          absl::lts_20240722::
          StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)&local_a0.status_);
          cVar8 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field);
          if ((cVar8 == '\"') ||
             (cVar8 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field),
             cVar8 == '\'')) {
            JsonLexer::ParseUtf8
                      ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)local_130,(JsonLexer *)field);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_a0.status_,
                        (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)local_130);
LAB_002cd79f:
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)local_130);
            (lex->stream_).stream_ = (ZeroCopyInputStream *)local_a0;
            if (((ulong)local_a0 & 1) == 0) {
              LOCK();
              *(int *)local_a0 = *(int *)local_a0 + 1;
              UNLOCK();
            }
            if (((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) ||
               (JsonLexer::Expect(lex,field,1,":"),
               (lex->stream_).stream_ != (ZeroCopyInputStream *)0x1)) goto LAB_002cdb6a;
            if (local_a0 !=
                (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )0x1) {
              absl::lts_20240722::internal_statusor::Helper::Crash(&local_a0.status_);
              uVar11 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_1a0.status_);
              absl::lts_20240722::internal_statusor::
              StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::
              ~StatusOrData((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                             *)&local_1a0.status_);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&local_a0.status_);
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_158);
              _Unwind_Resume(uVar11);
            }
            piVar1 = (int *)(*(size_t *)
                              ((long)&((field[4].pool_)->messages_).
                                      super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                                      .
                                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                                      .settings_.
                                      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                      .
                                      super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                              + 8) - 8);
            *piVar1 = *piVar1 + 1;
            local_130._0_16_ =
                 (undefined1  [16])MaybeOwnedString::AsView((MaybeOwnedString *)&local_98);
            local_1c0._M_dataplus._M_p = local_158;
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
            ::EmplaceDecomposable::operator()
                      (&local_48,&local_1c0,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_130,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_130);
            if (local_48.second == false) {
              local_178._16_16_ =
                   (undefined1  [16])MaybeOwnedString::AsView((MaybeOwnedString *)&local_98);
              local_1c0._M_string_length =
                   (size_type)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::
                   Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
              in_R8 = (char *)0x1;
              local_1c0._M_dataplus._M_p = (pointer)this;
              absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                        ((Msg *)local_130,"got unexpectedly-repeated repeated map key: \'%s\'",0x30,
                         &local_1c0);
              JsonLocation::Invalid
                        ((JsonLocation *)lex,
                         (HeapOrSoo *)
                         ((long)&local_98.enums_.
                                 super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
                                 .
                                 super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
                                 .settings_.
                                 super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         + 0x10),local_130._8_8_,local_130._0_8_);
              if ((Arena *)local_130._0_8_ != (Arena *)(local_130 + 0x10)) {
                operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
              }
            }
            else {
              uVar3 = *(ulong *)((msg->stream_).impl_.buffer_end_ + 0x30);
              local_178._0_8_ = &local_98;
              local_178._8_8_ = field;
              ParseProto3Type::RecordAsSeen((Field)msg,in_RCX);
              url._M_str = *(char **)((uVar3 & 0xfffffffffffffffc) + 8);
              url._M_len = **(size_t **)(msg->stream_).impl_.buffer_;
              ResolverPool::FindMessage((ResolverPool *)&local_1a0.status_,url);
              (lex->stream_).stream_ = (ZeroCopyInputStream *)local_1a0;
              if (((ulong)local_1a0 & 1) == 0) {
                LOCK();
                *(int *)local_1a0 = *(int *)local_1a0 + 1;
                UNLOCK();
              }
              if (local_1a0 ==
                  (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
                   )0x1) {
                local_190 = local_198;
                puVar4 = (msg->stream_).impl_.buffer_end_;
                if (*(int *)(puVar4 + 0x48) == 10) {
                  iVar2 = *(int *)(puVar4 + 0x50);
                  pbVar10 = (in_RCX->stream_).cur_;
                  if ((in_RCX->stream_).impl_.end_ <= pbVar10) {
                    pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback
                                        ((EpsCopyOutputStream *)in_RCX,pbVar10);
                  }
                  uVar12 = iVar2 * 8 + 3;
                  (in_RCX->stream_).cur_ = pbVar10;
                  uVar13 = uVar12;
                  if (0x7f < (uint)(iVar2 << 3)) {
                    do {
                      *pbVar10 = (byte)uVar13 | 0x80;
                      uVar12 = uVar13 >> 7;
                      pbVar10 = pbVar10 + 1;
                      bVar7 = 0x3fff < uVar13;
                      uVar13 = uVar12;
                    } while (bVar7);
                  }
                  *pbVar10 = (byte)uVar12;
                  (in_RCX->stream_).cur_ = pbVar10 + 1;
                  ParseMap<google::protobuf::json_internal::ParseProto3Type>::
                  anon_class_32_4_5119429f::operator()::anon_class_16_2_441bf789::operator()
                            ((anon_class_16_2_441bf789 *)lex,
                             (Desc<google::protobuf::json_internal::ParseProto3Type> *)local_178,
                             local_190);
                  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
                    iVar2 = *(int *)((msg->stream_).impl_.buffer_end_ + 0x50);
                    pbVar10 = (in_RCX->stream_).cur_;
                    if ((in_RCX->stream_).impl_.end_ <= pbVar10) {
                      pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback
                                          ((EpsCopyOutputStream *)in_RCX,pbVar10);
                    }
                    uVar12 = iVar2 * 8 + 4;
                    (in_RCX->stream_).cur_ = pbVar10;
                    uVar13 = uVar12;
                    if (0x7f < (uint)(iVar2 << 3)) {
                      do {
                        *pbVar10 = (byte)uVar13 | 0x80;
                        uVar12 = uVar13 >> 7;
                        pbVar10 = pbVar10 + 1;
                        bVar7 = 0x3fff < uVar13;
                        uVar13 = uVar12;
                      } while (bVar7);
                    }
                    *pbVar10 = (byte)uVar12;
                    (in_RCX->stream_).cur_ = pbVar10 + 1;
                    (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
                  }
                }
                else {
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                  local_1c0._M_string_length = 0;
                  local_1c0.field_2._M_local_buf[0] = '\0';
                  io::StringOutputStream::StringOutputStream(this,&local_1c0);
                  ParseProto3Type::Msg::Msg((Msg *)local_130,(ZeroCopyOutputStream *)this);
                  ParseMap<google::protobuf::json_internal::ParseProto3Type>::
                  anon_class_32_4_5119429f::operator()::anon_class_16_2_441bf789::operator()
                            ((anon_class_16_2_441bf789 *)lex,
                             (Desc<google::protobuf::json_internal::ParseProto3Type> *)local_178,
                             local_190);
                  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
                    local_f0._M_head_impl =
                         (Field *)io::EpsCopyOutputStream::Trim
                                            ((EpsCopyOutputStream *)local_130,local_f0._M_head_impl)
                    ;
                    _Var5._M_p = local_1c0._M_dataplus._M_p;
                    iVar9 = io::EpsCopyOutputStream::ByteCount
                                      ((EpsCopyOutputStream *)local_130,
                                       (uint8_t *)local_f0._M_head_impl);
                    x._M_str = in_R8;
                    x._M_len = (size_t)_Var5._M_p;
                    ParseProto3Type::SetString
                              ((ParseProto3Type *)msg,(Field)in_RCX,
                               (Msg *)(long)((int)iVar9 - local_e8),x);
                    (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
                  }
                  absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                  ::~raw_hash_set(&local_c0);
                  absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                  ::~raw_hash_set(&local_e0);
                  io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_130);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                                             local_1c0.field_2._M_local_buf[0]) + 1);
                  }
                }
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::
              ~StatusOrData((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                             *)&local_1a0.status_);
            }
            if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002cdb6a;
            literal_00._M_str = ",";
            literal_00._M_len = 1;
            local_1c9 = JsonLexer::Peek((JsonLexer *)field,literal_00);
            bVar7 = true;
          }
          else {
            if (*(char *)&field[2].type_ == '\x01') {
              JsonLexer::ParseBareWord
                        ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)local_130,(JsonLexer *)field);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&local_a0.status_,
                          (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_130);
              goto LAB_002cd79f;
            }
            JsonLocation::Invalid((JsonLocation *)lex,local_180,0xc,"expected \'\"\'");
LAB_002cdb6a:
            bVar7 = false;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&local_a0.status_);
          if (!bVar7) goto LAB_002cdc43;
          literal_01._M_str = "}";
          literal_01._M_len = 1;
          bVar7 = JsonLexer::Peek((JsonLexer *)field,literal_01);
        } while (!bVar7);
        piVar1 = (int *)((long)&field[2].parent_ + 4);
        *piVar1 = *piVar1 + 1;
        if ((*(char *)&field[2].type_ == '\0') && (local_1c9 != false)) {
          local_188 = "expected \'}\'";
LAB_002cdc2c:
          JsonLocation::Invalid((JsonLocation *)lex,local_180,0xc,local_188);
          goto LAB_002cdc43;
        }
      }
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
  }
LAB_002cdc43:
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_158);
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status ParseMap(JsonLexer& lex, Field<Traits> field, Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  absl::flat_hash_set<std::string> keys_seen;
  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& key) -> absl::Status {
        lex.path().NextRepeated();
        auto insert_result = keys_seen.emplace(key.value.AsView());
        if (!insert_result.second) {
          return key.loc.Invalid(absl::StrFormat(
              "got unexpectedly-repeated repeated map key: '%s'",
              key.value.AsView()));
        }
        return Traits::NewMsg(
            field, msg,
            [&](const Desc<Traits>& type, Msg<Traits>& entry) -> absl::Status {
              auto key_field = Traits::KeyField(type);
              switch (Traits::FieldType(key_field)) {
                case FieldDescriptor::TYPE_INT64:
                case FieldDescriptor::TYPE_SINT64:
                case FieldDescriptor::TYPE_SFIXED64: {
                  int64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT64:
                case FieldDescriptor::TYPE_FIXED64: {
                  uint64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_INT32:
                case FieldDescriptor::TYPE_SINT32:
                case FieldDescriptor::TYPE_SFIXED32: {
                  int32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT32:
                case FieldDescriptor::TYPE_FIXED32: {
                  uint32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_BOOL: {
                  if (key.value == "true") {
                    Traits::SetBool(key_field, entry, true);
                  } else if (key.value == "false") {
                    Traits::SetBool(key_field, entry, false);
                  } else {
                    return key.loc.Invalid(absl::StrFormat(
                        "expected bool string, got '%s'", key.value.AsView()));
                  }
                  break;
                }
                case FieldDescriptor::TYPE_STRING: {
                  Traits::SetString(key_field, entry,
                                    std::move(key.value.ToString()));
                  break;
                }
                default:
                  return lex.Invalid("unsupported map key type");
              }

              return ParseSingular<Traits>(lex, Traits::ValueField(type),
                                           entry);
            });
      });
}